

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

void __thiscall QPlainTextEdit::paintEvent(QPlainTextEdit *this,QPaintEvent *e)

{
  undefined1 (*pauVar1) [16];
  QWidgetData *pQVar2;
  QWidgetTextControl *this_00;
  int *piVar3;
  undefined1 auVar4 [16];
  undefined1 *puVar5;
  Selection *pSVar6;
  char cVar7;
  bool bVar8;
  TextInteractionFlags TVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  Representation RVar13;
  undefined4 uVar14;
  QWidget *pQVar15;
  long *plVar16;
  QArrayData *pQVar17;
  QPainter *pQVar18;
  QBrush *pQVar19;
  QScrollBar *pQVar20;
  QPalette *pQVar21;
  int iVar22;
  long lVar23;
  undefined1 *extraout_RDX;
  QPaintDevice *pQVar24;
  undefined8 *puVar25;
  BrushStyle BVar26;
  PaintContext *pPVar27;
  int iVar28;
  ulong uVar29;
  QTextFormat *pQVar30;
  long in_FS_OFFSET;
  bool bVar31;
  bool bVar32;
  byte bVar33;
  undefined1 *puVar34;
  undefined1 *puVar35;
  double dVar36;
  double dVar37;
  QPointF QVar38;
  QBrush bg;
  QPainter painter;
  PaintContext context;
  double dStack_1a0;
  QArrayData *local_160;
  long local_150;
  long local_148;
  undefined1 *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  qreal local_128;
  double dStack_120;
  undefined1 local_110 [8];
  undefined8 local_108;
  undefined1 *puStack_100;
  undefined1 *local_f8;
  QRectF local_e8;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 local_b8 [24];
  double dStack_a0;
  QArrayDataPointer<QAbstractTextDocumentLayout::Selection> local_80;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  undefined1 *apuStack_50 [2];
  double dStack_40;
  long local_38;
  
  bVar33 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar23 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  local_110 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  pQVar15 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  pQVar24 = &pQVar15->super_QPaintDevice;
  if (pQVar15 == (QWidget *)0x0) {
    pQVar24 = (QPaintDevice *)0x0;
  }
  QPainter::QPainter((QPainter *)local_110,pQVar24);
  local_128 = -NAN;
  dStack_120 = -NAN;
  QVar38 = contentOffset(this);
  local_128 = QVar38.xp;
  dStack_120 = QVar38.yp;
  local_138 = *(undefined8 *)(e + 0x10);
  uStack_130 = *(undefined8 *)(e + 0x18);
  pQVar15 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  pQVar2 = pQVar15->data;
  iVar28 = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
  iVar22 = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
  this_00 = *(QWidgetTextControl **)
             (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 + 800
             );
  if (this_00 == (QWidgetTextControl *)0x0) {
    bVar31 = true;
  }
  else {
    TVar9 = QWidgetTextControl::textInteractionFlags(this_00);
    bVar31 = ((uint)TVar9.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                    super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) == 0;
  }
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::document
            (*(QWidgetTextControl **)
              (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 +
              800));
  QTextDocument::findBlockByNumber((int)local_68);
  QWidgetTextControl::document
            (*(QWidgetTextControl **)
              (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 +
              800));
  plVar16 = (long *)QTextDocument::documentLayout();
  puVar34 = (undefined1 *)(**(code **)(*plVar16 + 0x78))(plVar16);
  QPainter::setBrushOrigin((QPointF *)local_110);
  puVar35 = (undefined1 *)(double)(iVar28 + 1);
  puVar5 = puVar34;
  if ((double)puVar34 <= (double)puVar35) {
    puVar5 = puVar35;
  }
  dVar37 = (double)puVar5 + local_128;
  QWidgetTextControl::document
            (*(QWidgetTextControl **)
              (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 +
              800));
  dVar36 = (double)QTextDocument::documentMargin();
  iVar10 = QWidgetTextControl::cursorWidth
                     (*(QWidgetTextControl **)
                       (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.
                                  field_0x8 + 800));
  iVar10 = (int)((double)iVar10 + (dVar37 - dVar36));
  if ((int)uStack_130 < iVar10) {
    iVar10 = (int)uStack_130;
  }
  uStack_130 = CONCAT44(uStack_130._4_4_,iVar10);
  QPainter::setClipRect((QRect *)local_110,(ClipOperation)&local_138);
  lVar23 = *(long *)(lVar23 + 8);
  pQVar17 = (QArrayData *)
            QWidgetTextControl::document(*(QWidgetTextControl **)(*(long *)(lVar23 + 8) + 800));
  cVar7 = QTextDocument::isEmpty();
  if (cVar7 == '\0') {
    bVar32 = false;
  }
  else {
    lVar23 = *(long *)(lVar23 + 8);
    pQVar17 = *(QArrayData **)(lVar23 + 0x308);
    lVar23 = *(long *)(lVar23 + 0x318);
    if (pQVar17 != (QArrayData *)0x0) {
      LOCK();
      (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar32 = lVar23 != 0;
  }
  if (cVar7 == '\x01' && pQVar17 != (QArrayData *)0x0) {
    LOCK();
    (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar17->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar17,2,0x10);
    }
  }
  if (bVar32) {
    local_e8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    QWidgetTextControl::palette((QWidgetTextControl *)local_b8);
    plVar16 = (long *)QPalette::brush((ColorGroup)(QPalette *)local_b8,Dark);
    local_e8.xp = *(qreal *)(*plVar16 + 8);
    local_e8.yp = *(qreal *)(*plVar16 + 0x10);
    QPalette::~QPalette((QPalette *)local_b8);
    QPainter::setPen((QColor *)local_110);
    QPainter::setClipRect((QRect *)local_110,(int)e + 0x10);
    QWidgetTextControl::document
              (*(QWidgetTextControl **)
                (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 +
                800));
    dVar37 = (double)QTextDocument::documentMargin();
    iVar10 = (int)dVar37;
    local_b8._0_8_ = (undefined8)iVar10;
    local_b8._8_8_ = (undefined8)iVar10;
    local_b8._16_8_ = (undefined8)(((long)iVar28 - (long)iVar10) + 1);
    dStack_a0 = (double)(((long)iVar22 - (long)iVar10) + 1);
    lVar23 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
    pauVar1 = (undefined1 (*) [16])(lVar23 + 0x308);
    piVar3 = *(int **)*pauVar1;
    _local_58 = *pauVar1;
    apuStack_50[1] = *(undefined1 **)(lVar23 + 0x318);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    QPainter::drawText((QRectF *)local_110,(int)local_b8,(QString *)0x1020,(QRectF *)local_58);
    if (local_58 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)local_58 = *(int *)local_58 + -1;
      UNLOCK();
      if (*(int *)local_58 == 0) {
        QArrayData::deallocate((QArrayData *)local_58,2,0x10);
      }
    }
  }
  puVar25 = &DAT_006ee180;
  pPVar27 = (PaintContext *)local_b8;
  for (lVar23 = 10; lVar23 != 0; lVar23 = lVar23 + -1) {
    *(undefined8 *)pPVar27 = *puVar25;
    puVar25 = puVar25 + (ulong)bVar33 * -2 + 1;
    pPVar27 = (PaintContext *)((long)pPVar27 + (ulong)bVar33 * -0x10 + 8);
  }
  lVar23 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  QWidgetTextControl::getPaintContext
            ((PaintContext *)local_b8,*(QWidgetTextControl **)(lVar23 + 800),
             *(QWidget **)(lVar23 + 0x2b0));
  QPalette::brush((int)local_b8 + 8,Dark);
  QPainter::setPen((QColor *)local_110);
  cVar7 = QTextBlock::isValid();
  if (cVar7 != '\0') {
    do {
      blockBoundingRect((QRectF *)local_58,this,(QTextBlock *)local_68);
      dVar36 = dStack_40;
      puVar5 = apuStack_50[1];
      dVar37 = (double)local_58 + local_128;
      auVar4._8_4_ = SUB84((double)apuStack_50[0] + dStack_120,0);
      auVar4._0_8_ = dVar37;
      auVar4._12_4_ = (int)((ulong)((double)apuStack_50[0] + dStack_120) >> 0x20);
      pQVar18 = (QPainter *)QTextBlock::layout();
      cVar7 = QTextBlock::isVisible();
      if (cVar7 == '\0') {
        dStack_120 = dVar36 + dStack_120;
      }
      else {
        dStack_1a0 = auVar4._8_8_;
        if (((double)local_138._4_4_ <= dStack_1a0 + dVar36) &&
           (dStack_1a0 <= (double)uStack_130._4_4_)) {
          local_c8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
          QTextBlock::blockFormat();
          local_140 = &DAT_aaaaaaaaaaaaaaaa;
          BVar26 = (BrushStyle)(QBrush *)&local_140;
          QTextFormat::brushProperty(BVar26);
          cVar7 = QBrush::doCompareEqualStyle(BVar26);
          if (cVar7 == '\0') {
            apuStack_50[0] = (undefined1 *)dStack_1a0;
            local_58 = (undefined1  [8])dVar37;
            apuStack_50[1] = puVar34;
            if ((double)puVar34 <= (double)puVar5) {
              apuStack_50[1] = puVar5;
            }
            dStack_40 = dVar36;
            QBrush::QBrush((QBrush *)&local_148,(QBrush *)&local_140);
            QPainter::save();
            if (2 < *(int *)(local_148 + 4) - 0xfU) {
              local_e8.xp = (qreal)local_58;
              local_e8.yp = (qreal)apuStack_50[0];
              QPainter::setBrushOrigin((QPointF *)local_110);
            }
            QPainter::fillRect((QRectF *)local_110,(QBrush *)local_58);
            QPainter::restore();
            QBrush::~QBrush((QBrush *)&local_148);
          }
          local_e8.xp = 0.0;
          local_e8.yp = 0.0;
          local_e8.w = 0.0;
          iVar28 = QTextBlock::position();
          iVar10 = QTextBlock::length();
          if (local_80.size != 0) {
            lVar23 = 0;
            uVar29 = 0;
            do {
              pSVar6 = local_80.ptr;
              iVar11 = QTextCursor::selectionStart();
              iVar12 = QTextCursor::selectionEnd();
              if (((iVar11 < iVar12) && (iVar11 = iVar11 - iVar28, iVar11 < iVar10)) &&
                 (0 < iVar12 - iVar28)) {
                apuStack_50[1] = &DAT_aaaaaaaaaaaaaaaa;
                local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
                apuStack_50[0] = &DAT_aaaaaaaaaaaaaaaa;
                QTextCharFormat::QTextCharFormat((QTextCharFormat *)(local_58 + 8));
                local_58._4_4_ = (iVar12 - iVar28) - iVar11;
                local_58._0_4_ = iVar11;
                QTextFormat::operator=
                          ((QTextFormat *)(local_58 + 8),
                           &(pSVar6->format).super_QTextFormat + lVar23);
                QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::
                emplace<QTextLayout::FormatRange_const&>
                          ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_e8,
                           (qsizetype)local_e8.w,(FormatRange *)local_58);
                QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_e8);
LAB_004a1cd9:
                QTextFormat::~QTextFormat((QTextFormat *)(local_58 + 8));
              }
              else {
                cVar7 = QTextCursor::hasSelection();
                if (cVar7 == '\0') {
                  pQVar30 = &(pSVar6->format).super_QTextFormat + lVar23;
                  cVar7 = QTextFormat::hasProperty((int)pQVar30);
                  if (cVar7 != '\0') {
                    QTextCursor::position();
                    cVar7 = QTextBlock::contains((int)local_68);
                    if (cVar7 != '\0') {
                      apuStack_50[1] = &DAT_aaaaaaaaaaaaaaaa;
                      apuStack_50[0] = &DAT_aaaaaaaaaaaaaaaa;
                      local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
                      QTextCharFormat::QTextCharFormat((QTextCharFormat *)(local_58 + 8));
                      local_108 = &DAT_aaaaaaaaaaaaaaaa;
                      puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
                      QTextCursor::position();
                      RVar13.m_i = QTextLayout::lineForTextPosition((int)pQVar18);
                      local_108 = (undefined1 *)CONCAT44(local_108._4_4_,RVar13.m_i);
                      puStack_100 = extraout_RDX;
                      uVar14 = QTextLine::textStart();
                      local_58._0_4_ = uVar14;
                      iVar11 = QTextLine::textLength();
                      if (local_58._0_4_ + iVar11 == iVar10 + -1) {
                        iVar11 = iVar11 + 1;
                      }
                      local_58._4_4_ = iVar11;
                      QTextFormat::operator=((QTextFormat *)(local_58 + 8),pQVar30);
                      QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::
                      emplace<QTextLayout::FormatRange_const&>
                                ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_e8,
                                 (qsizetype)local_e8.w,(FormatRange *)local_58);
                      QList<QTextLayout::FormatRange>::end
                                ((QList<QTextLayout::FormatRange> *)&local_e8);
                      goto LAB_004a1cd9;
                    }
                  }
                }
              }
              uVar29 = uVar29 + 1;
              lVar23 = lVar23 + 0x18;
            } while (uVar29 < (ulong)local_80.size);
          }
          if ((bVar31) &&
             (TVar9 = QWidgetTextControl::textInteractionFlags
                                (*(QWidgetTextControl **)
                                  (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.
                                             super_QWidget.field_0x8 + 800)),
             ((uint)TVar9.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                    super_QFlagsStorage<Qt::TextInteractionFlag>.i & 2) == 0)) {
            bVar32 = false;
          }
          else {
            bVar32 = iVar28 <= (int)local_b8._0_4_ && (int)local_b8._0_4_ < iVar10 + iVar28;
          }
          if (bVar32) {
            bVar8 = QWidgetTextControl::overwriteMode
                              (*(QWidgetTextControl **)
                                (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.
                                           super_QWidget.field_0x8 + 800));
          }
          else {
            bVar8 = false;
          }
          if (bVar8 != false) {
            if (local_b8._0_4_ == iVar10 + iVar28 + -1) {
              bVar8 = false;
            }
            else {
              local_f8 = &DAT_aaaaaaaaaaaaaaaa;
              local_108 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
              QTextCharFormat::QTextCharFormat((QTextCharFormat *)&puStack_100);
              local_108 = (undefined1 *)CONCAT44(1,local_b8._0_4_ - iVar28);
              pQVar21 = QWidget::palette((QWidget *)this);
              pQVar19 = (QBrush *)QPalette::brush((ColorGroup)pQVar21,Dark);
              QBrush::operator_cast_to_QVariant((QVariant *)local_58,pQVar19);
              iVar10 = (int)(QTextFormat *)&puStack_100;
              QTextFormat::setProperty(iVar10,(QVariant *)0x821);
              ::QVariant::~QVariant((QVariant *)local_58);
              pQVar21 = QWidget::palette((QWidget *)this);
              pQVar19 = (QBrush *)QPalette::brush((ColorGroup)pQVar21,Dark);
              QBrush::operator_cast_to_QVariant((QVariant *)local_58,pQVar19);
              QTextFormat::setProperty(iVar10,(QVariant *)0x820);
              ::QVariant::~QVariant((QVariant *)local_58);
              QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::
              emplace<QTextLayout::FormatRange_const&>
                        ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_e8,
                         (qsizetype)local_e8.w,(FormatRange *)&local_108);
              QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_e8);
              QTextFormat::~QTextFormat((QTextFormat *)&puStack_100);
            }
          }
          iVar10 = (int)((ulong)local_138 >> 0x20);
          dVar37 = (double)iVar10;
          apuStack_50[0]._0_4_ = SUB84(dVar37,0);
          local_58 = (undefined1  [8])(double)(int)local_138;
          unique0x10000483 = (int)((ulong)dVar37 >> 0x20);
          apuStack_50[1] =
               (undefined1 *)(double)(((long)(int)uStack_130 - (long)(int)local_138) + 1);
          dStack_40 = (double)(((long)uStack_130._4_4_ - (long)iVar10) + 1);
          QTextLayout::draw(pQVar18,(QPointF *)local_110,(QList_conflict *)&local_128,&local_e8);
          if ((bVar8 == false) && (bVar32)) {
            bVar8 = true;
            bVar32 = false;
          }
          else if ((int)local_b8._0_4_ < -1 && !bVar31) {
            QTextLayout::preeditAreaText();
            bVar8 = local_150 != 0;
            bVar32 = true;
          }
          else {
            bVar32 = false;
            bVar8 = false;
          }
          if ((bVar32) && (local_160 != (QArrayData *)0x0)) {
            LOCK();
            (local_160->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_160->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_160->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_160,2,0x10);
            }
          }
          if (bVar8) {
            uVar14 = local_b8._0_4_;
            if ((int)local_b8._0_4_ < -1) {
              iVar28 = QTextLayout::preeditAreaPosition();
              iVar28 = (iVar28 - uVar14) + -2;
            }
            else {
              iVar28 = local_b8._0_4_ - iVar28;
            }
            QWidgetTextControl::cursorWidth
                      (*(QWidgetTextControl **)
                        (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.
                                   field_0x8 + 800));
            QTextLayout::drawCursor(pQVar18,(QPointF *)local_110,(int)&local_128,iVar28);
          }
          QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer
                    ((QArrayDataPointer<QTextLayout::FormatRange> *)&local_e8);
          QBrush::~QBrush((QBrush *)&local_140);
          QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
        }
        dStack_120 = dVar36 + dStack_120;
        if ((double)(iVar22 + 1) < dStack_120) break;
      }
      QTextBlock::next();
      local_68._0_8_ = local_58;
      local_68._8_4_ = apuStack_50[0]._0_4_;
      cVar7 = QTextBlock::isValid();
    } while (cVar7 != '\0');
  }
  if ((((*(byte *)(*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8
                  + 0x348) & 4) != 0) && (cVar7 = QTextBlock::isValid(), cVar7 == '\0')) &&
     (dStack_120 <= (double)uStack_130._4_4_)) {
    if ((*(byte *)(*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8
                  + 0x348) & 8) == 0) {
      pQVar20 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar22 = QAbstractSlider::maximum(&pQVar20->super_QAbstractSlider);
      pQVar20 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar28 = QAbstractSlider::minimum(&pQVar20->super_QAbstractSlider);
      if (iVar22 != iVar28) goto LAB_004a22be;
    }
    local_58._4_4_ = (int)dStack_120;
    local_58._0_4_ = (undefined4)local_138;
    apuStack_50[0] = (undefined1 *)uStack_130;
    pQVar21 = QWidget::palette((QWidget *)this);
    QPalette::brush((ColorGroup)pQVar21,Dark);
    QPainter::fillRect((QRect *)local_110,(QBrush *)local_58);
  }
LAB_004a22be:
  QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::~QArrayDataPointer(&local_80);
  QPalette::~QPalette((QPalette *)(local_b8 + 8));
  QPainter::~QPainter((QPainter *)local_110);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEdit::paintEvent(QPaintEvent *e)
{
    Q_D(QPlainTextEdit);
    QPainter painter(viewport());
    Q_ASSERT(qobject_cast<QPlainTextDocumentLayout*>(document()->documentLayout()));

    QPointF offset(contentOffset());

    QRect er = e->rect();
    QRect viewportRect = viewport()->rect();

    bool editable = !isReadOnly();

    QTextBlock block = firstVisibleBlock();
    qreal maximumWidth = document()->documentLayout()->documentSize().width();

    // Set a brush origin so that the WaveUnderline knows where the wave started
    painter.setBrushOrigin(offset);

    // keep right margin clean from full-width selection
    int maxX = offset.x() + qMax((qreal)viewportRect.width(), maximumWidth)
               - document()->documentMargin() + cursorWidth();
    er.setRight(qMin(er.right(), maxX));
    painter.setClipRect(er);

    if (d->placeHolderTextToBeShown()) {
        const QColor col = d->control->palette().placeholderText().color();
        painter.setPen(col);
        painter.setClipRect(e->rect());
        const int margin = int(document()->documentMargin());
        QRectF textRect = viewportRect.adjusted(margin, margin, 0, 0);
        painter.drawText(textRect, Qt::AlignTop | Qt::TextWordWrap, placeholderText());
    }

    QAbstractTextDocumentLayout::PaintContext context = getPaintContext();
    painter.setPen(context.palette.text().color());

    while (block.isValid()) {

        QRectF r = blockBoundingRect(block).translated(offset);
        QTextLayout *layout = block.layout();

        if (!block.isVisible()) {
            offset.ry() += r.height();
            block = block.next();
            continue;
        }

        if (r.bottom() >= er.top() && r.top() <= er.bottom()) {

            QTextBlockFormat blockFormat = block.blockFormat();

            QBrush bg = blockFormat.background();
            if (bg != Qt::NoBrush) {
                QRectF contentsRect = r;
                contentsRect.setWidth(qMax(r.width(), maximumWidth));
                fillBackground(&painter, contentsRect, bg);
            }

            QList<QTextLayout::FormatRange> selections;
            int blpos = block.position();
            int bllen = block.length();
            for (int i = 0; i < context.selections.size(); ++i) {
                const QAbstractTextDocumentLayout::Selection &range = context.selections.at(i);
                const int selStart = range.cursor.selectionStart() - blpos;
                const int selEnd = range.cursor.selectionEnd() - blpos;
                if (selStart < bllen && selEnd > 0
                    && selEnd > selStart) {
                    QTextLayout::FormatRange o;
                    o.start = selStart;
                    o.length = selEnd - selStart;
                    o.format = range.format;
                    selections.append(o);
                } else if (!range.cursor.hasSelection() && range.format.hasProperty(QTextFormat::FullWidthSelection)
                           && block.contains(range.cursor.position())) {
                    // for full width selections we don't require an actual selection, just
                    // a position to specify the line. that's more convenience in usage.
                    QTextLayout::FormatRange o;
                    QTextLine l = layout->lineForTextPosition(range.cursor.position() - blpos);
                    o.start = l.textStart();
                    o.length = l.textLength();
                    if (o.start + o.length == bllen - 1)
                        ++o.length; // include newline
                    o.format = range.format;
                    selections.append(o);
                }
            }

            bool drawCursor = ((editable || (textInteractionFlags() & Qt::TextSelectableByKeyboard))
                               && context.cursorPosition >= blpos
                               && context.cursorPosition < blpos + bllen);

            bool drawCursorAsBlock = drawCursor && overwriteMode() ;

            if (drawCursorAsBlock) {
                if (context.cursorPosition == blpos + bllen - 1) {
                    drawCursorAsBlock = false;
                } else {
                    QTextLayout::FormatRange o;
                    o.start = context.cursorPosition - blpos;
                    o.length = 1;
                    o.format.setForeground(palette().base());
                    o.format.setBackground(palette().text());
                    selections.append(o);
                }
            }

            layout->draw(&painter, offset, selections, er);

            if ((drawCursor && !drawCursorAsBlock)
                || (editable && context.cursorPosition < -1
                    && !layout->preeditAreaText().isEmpty())) {
                int cpos = context.cursorPosition;
                if (cpos < -1)
                    cpos = layout->preeditAreaPosition() - (cpos + 2);
                else
                    cpos -= blpos;
                layout->drawCursor(&painter, offset, cpos, cursorWidth());
            }
        }

        offset.ry() += r.height();
        if (offset.y() > viewportRect.height())
            break;
        block = block.next();
    }

    if (backgroundVisible() && !block.isValid() && offset.y() <= er.bottom()
        && (centerOnScroll() || verticalScrollBar()->maximum() == verticalScrollBar()->minimum())) {
        painter.fillRect(QRect(QPoint((int)er.left(), (int)offset.y()), er.bottomRight()), palette().window());
    }
}